

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexImageCubeAlignCase::createTexture(TexImageCubeAlignCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  int iVar1;
  uint cellSize;
  int iVar2;
  int i_1;
  int i;
  long lVar3;
  uint rowPitch;
  int level;
  uint width;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  float local_98 [4];
  Vec4 colorB;
  float local_78 [4];
  Vec4 colorA;
  Vector<float,_4> res_1;
  
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  if (0 < (this->super_TextureCubeSpecCase).m_numLevels) {
    this_01 = &(this->super_TextureCubeSpecCase).m_texFormat;
    level = 0;
    do {
      width = (this->super_TextureCubeSpecCase).m_size >> ((byte)level & 0x1f);
      if ((int)width < 2) {
        width = 1;
      }
      iVar2 = tcu::TextureFormat::getPixelSize(this_01);
      iVar1 = this->m_alignment;
      colorB.m_data[0] = 1.0;
      colorB.m_data[1] = 0.0;
      colorB.m_data[2] = 0.0;
      colorB.m_data[3] = 1.0;
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      lVar3 = 0;
      do {
        local_98[lVar3] =
             (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar3] -
             (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      res_1.m_data[0] = 0.0;
      res_1.m_data[1] = 0.0;
      res_1.m_data[2] = 0.0;
      res_1.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        res_1.m_data[lVar3] = colorB.m_data[lVar3] * local_98[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      colorA.m_data[0] = 0.0;
      colorA.m_data[1] = 0.0;
      colorA.m_data[2] = 0.0;
      colorA.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        colorA.m_data[lVar3] =
             res_1.m_data[lVar3] +
             (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_98[0] = 0.0;
      local_98[1] = 1.0;
      local_98[2] = 0.0;
      local_98[3] = 1.0;
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 0.0;
      lVar3 = 0;
      do {
        local_78[lVar3] =
             (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar3] -
             (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      res_1.m_data[0] = 0.0;
      res_1.m_data[1] = 0.0;
      res_1.m_data[2] = 0.0;
      res_1.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        res_1.m_data[lVar3] = local_98[lVar3] * local_78[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      colorB.m_data[0] = 0.0;
      colorB.m_data[1] = 0.0;
      colorB.m_data[2] = 0.0;
      colorB.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        colorB.m_data[lVar3] =
             res_1.m_data[lVar3] +
             (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      rowPitch = iVar2 * width + -1 + iVar1 & -iVar1;
      cellSize = width >> 2;
      if (width >> 2 < 2) {
        cellSize = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data,(long)(int)(rowPitch * width));
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,this_01,width,width,1,rowPitch,0,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::fillWithGrid((PixelBufferAccess *)&res_1,cellSize,&colorA,&colorB);
      lVar3 = 0;
      do {
        sglr::ContextWrapper::glTexImage2D
                  (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar3),level,this->m_internalFormat
                   ,width,width,0,this->m_format,this->m_dataType,
                   data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x18);
      level = level + 1;
    } while (level < (this->super_TextureCubeSpecCase).m_numLevels);
  }
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelSize	= de::max(1, m_size >> ndx);
			int		rowPitch	= deAlign32(m_texFormat.getPixelSize()*levelSize, m_alignment);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		cellSize	= de::max(1, levelSize >> 2);

			data.resize(rowPitch*levelSize);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelSize, levelSize, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, &data[0]);
		}
	}